

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.h
# Opt level: O2

void __thiscall
cfd::CoinSelectionOption::CoinSelectionOption
          (CoinSelectionOption *this,CoinSelectionOption *param_1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int64_t iVar3;
  bool bVar4;
  undefined3 uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  int iVar9;
  
  this->has_ignore_fee_asset_ = param_1->has_ignore_fee_asset_;
  bVar4 = param_1->use_bnb_;
  uVar5 = *(undefined3 *)&param_1->field_0x1;
  uVar6 = param_1->change_output_size_;
  uVar7 = param_1->change_spend_size_;
  uVar8 = *(undefined4 *)&param_1->field_0xc;
  uVar1 = param_1->effective_fee_baserate_;
  uVar2 = param_1->long_term_fee_baserate_;
  iVar3 = param_1->dust_fee_rate_;
  this->knapsack_minimum_change_ = param_1->knapsack_minimum_change_;
  this->dust_fee_rate_ = iVar3;
  this->effective_fee_baserate_ = uVar1;
  this->long_term_fee_baserate_ = uVar2;
  this->use_bnb_ = bVar4;
  *(undefined3 *)&this->field_0x1 = uVar5;
  this->change_output_size_ = uVar6;
  this->change_spend_size_ = uVar7;
  *(undefined4 *)&this->field_0xc = uVar8;
  core::ConfidentialAssetId::ConfidentialAssetId(&this->fee_asset_,&param_1->fee_asset_);
  iVar9 = param_1->minimum_bits_;
  this->exponent_ = param_1->exponent_;
  this->minimum_bits_ = iVar9;
  return;
}

Assistant:

class CFD_EXPORT CoinSelectionOption {
 public:
  /**
   * @brief constructor.
   */
  CoinSelectionOption();

  /**
   * @brief Get the BnB using flag.
   * @retval true   use BnB
   * @retval false  unuse BnB
   */
  bool IsUseBnB() const;
  /**
   * @brief Get the output change size.
   * @return output change size.
   */
  uint32_t GetChangeOutputSize() const;
  /**
   * @brief Get the spend change size.
   * @return spend change size.
   */
  uint32_t GetChangeSpendSize() const;
  /**
   * @brief Get an effective fee baserate.
   * @return effective fee baserate.
   */
  uint64_t GetEffectiveFeeBaserate() const;
  /**
   * @brief Get a long-term fee baserate.
   * @return long-term fee baserate.
   */
  uint64_t GetLongTermFeeBaserate() const;
  /**
   * @brief Get the minimum addition value when searching for knapsack.
   * @return knapsack minimum change
   */
  int64_t GetKnapsackMinimumChange() const;
  /**
   * @brief Get the maximum amount that will be included in Fee as dust.
   * @param[in] address     txout address
   * @return dust fee satoshi
   */
  Amount GetDustFeeAmount(const Address& address) const;
  /**
   * @brief Get the ignore fee asset flag.
   * @return ignore fee asset flag.
   */
  bool HasIgnoreFeeAsset() const;

  /**
   * @brief Set the BnB using flag.
   * @param[in] use_bnb   BnB using flag.
   */
  void SetUseBnB(bool use_bnb);
  /**
   * @brief Set the output change size.
   * @param[in] size    output change size.
   */
  void SetChangeOutputSize(size_t size);
  /**
   * @brief Set the spend change size.
   * @param[in] size    spend change size.
   */
  void SetChangeSpendSize(size_t size);
  /**
   * @brief Set an effective fee baserate.
   * @param[in] baserate    fee baserate (for BTC/byte)
   */
  void SetEffectiveFeeBaserate(double baserate);
  /**
   * @brief Set a long-term fee baserate.
   * @param[in] baserate    fee baserate (for BTC/byte)
   */
  void SetLongTermFeeBaserate(double baserate);
  /**
   * @brief Set the minimum addition value when searching for knapsack.
   * @param[in] min_change    knapsack minimum change
   */
  void SetKnapsackMinimumChange(int64_t min_change);
  /**
   * @brief Set the maximum amount that will be included in Fee as dust.
   * @param[in] baserate    fee baserate (for BTC/byte)
   */
  void SetDustFeeRate(double baserate);
  /**
   * @brief Set the ignore fee asset.
   * @param[in] has_ignore_fee_asset    ignore fee asset
   */
  void SetIgnoreFeeAsset(bool has_ignore_fee_asset);

  /**
   * @brief Initializes size related information equivalent to bitcoin.
   */
  void InitializeTxSizeInfo();

#ifndef CFD_DISABLE_ELEMENTS
  /**
   * @brief Get the asset to use for the fee.
   * @return asset to use for the fee.
   */
  ConfidentialAssetId GetFeeAsset() const;
  /**
   * @brief Set the asset to use for the fee.
   * @param[in] asset   asset
   */
  void SetFeeAsset(const ConfidentialAssetId& asset);
  /**
   * @brief Get the maximum amount that will be included in Fee as dust.
   * @param[in] address     txout address
   * @return dust fee satoshi
   */
  Amount GetConfidentialDustFeeAmount(const Address& address) const;

  /**
   * @brief set blind information.
   * @param[in] exponent                  rangeproof exponent value.
   *   -1 to 18. -1 is public value. 0 is most private.
   * @param[in] minimum_bits              rangeproof blinding bits.
   *   0 to 64. Number of bits of the value to keep private. 0 is auto.
   */
  void SetBlindInfo(int exponent, int minimum_bits);

  /**
   * @brief get blind information.
   * @param[out] exponent                  rangeproof exponent value.
   *   -1 to 18. -1 is public value. 0 is most private.
   * @param[out] minimum_bits              rangeproof blinding bits.
   *   0 to 64. Number of bits of the value to keep private. 0 is auto.
   */
  void GetBlindInfo(int* exponent, int* minimum_bits) const;

  /**
   * @brief Initializes size-related information based on Confidential Tx.
   */
  void InitializeConfidentialTxSizeInfo();
#endif  // CFD_DISABLE_ELEMENTS

 private:
  bool use_bnb_ = true;              //!< BnB using flag
  uint32_t change_output_size_ = 0;  //!< output change size
  uint32_t change_spend_size_ = 0;   //!< spend change size
  uint64_t effective_fee_baserate_;  //!< fee baserate
  uint64_t long_term_fee_baserate_;  //!< longterm fee baserate
  int64_t knapsack_minimum_change_;  //!< knapsack min change
  int64_t dust_fee_rate_;            //!< dust fee rate
  bool has_ignore_fee_asset_;        //!< ignore fee asset
#ifndef CFD_DISABLE_ELEMENTS
  ConfidentialAssetId fee_asset_;  //!< asset to be used as a fee
  int exponent_ = 0;               //!< rangeproof exponent value
  int minimum_bits_ = cfd::core::kDefaultBlindMinimumBits;  //!< minimum bits
#endif  // CFD_DISABLE_ELEMENTS
}